

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O2

void __thiscall
Logging::logValue(Logging *this,long populationID,int neuronID,int valueType,double value)

{
  int local_50;
  int local_4c;
  double local_48;
  double local_40;
  long local_38;
  
  local_50 = valueType;
  local_4c = neuronID;
  local_40 = value;
  local_38 = populationID;
  local_48 = Clock::getCurrentTime(this->clock);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->value_time,&local_48);
  std::vector<long,_std::allocator<long>_>::push_back(&this->value_populationID,&local_38);
  std::vector<int,_std::allocator<int>_>::push_back(&this->value_neuronID,&local_4c);
  std::vector<int,_std::allocator<int>_>::push_back(&this->value_valueType,&local_50);
  std::vector<double,_std::allocator<double>_>::push_back(&this->value_value,&local_40);
  return;
}

Assistant:

void Logging::logValue(long populationID, int neuronID, int valueType, double value) {
    value_time.push_back(clock->getCurrentTime());
    value_populationID.push_back(populationID);
    value_neuronID.push_back(neuronID);
    value_valueType.push_back(valueType);
    value_value.push_back(value);
}